

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmem.c
# Opt level: O1

gpointer g_try_malloc0(gsize n_bytes)

{
  void *pvVar1;
  
  if (n_bytes != 0) {
    pvVar1 = calloc(1,n_bytes);
    return pvVar1;
  }
  return (gpointer)0x0;
}

Assistant:

gpointer g_try_malloc0 (gsize n_bytes)
{
    gpointer mem;

    if (n_bytes)
        mem = calloc (1, n_bytes);
    else
        mem = NULL;

    return mem;
}